

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

printer * __thiscall boost::ext::ut::v1_1_8::printer::operator<<(printer *this,raw_problem *t)

{
  raw_problem local_e0;
  raw_problem *local_18;
  raw_problem *t_local;
  printer *this_local;
  
  local_18 = t;
  t_local = (raw_problem *)this;
  detail::get<baryonyx::raw_problem>(&local_e0,t);
  baryonyx::operator<<((ostream *)&this->field_0x40,&local_e0);
  baryonyx::raw_problem::~raw_problem(&local_e0);
  return this;
}

Assistant:

auto& operator<<(const T& t) {
      out_ << detail::get(t);
      return *this;
    }